

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# garbage_collection.cpp
# Opt level: O2

void scm::mark(Environment *env)

{
  Verbosity VVar1;
  _Base_ptr p_Var2;
  Object *obj;
  double __x;
  string local_50;
  
  for (p_Var2 = (env->bindings)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &(env->bindings)._M_t._M_impl.super__Rb_tree_header;
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
    VVar1 = loguru::current_verbosity_cutoff();
    if ((-1 < VVar1) && (LOG_GARBAGE_COLLECTION != '\0')) {
      toString_abi_cxx11_(&local_50,*(scm **)(p_Var2 + 2),obj);
      loguru::log(__x);
      std::__cxx11::string::~string((string *)&local_50);
    }
    markSchemeObject(*(Object **)(p_Var2 + 2));
  }
  return;
}

Assistant:

void mark(Environment& env)
{
  for (auto& binding : env.bindings) {
    DLOG_IF_F(INFO,
              LOG_GARBAGE_COLLECTION,
              "marking binding %s | %s",
              binding.first.c_str(),
              toString(binding.second).c_str());
    markSchemeObject(binding.second);
  }
}